

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O0

bool __thiscall QuickConnection::SendPayload(QuickConnection *this,void *data,uint16_t data_len)

{
  uint16_t sequence_number;
  uint16_t data_len_00;
  uint8_t *data_00;
  QuickPayload *this_00;
  bool bVar1;
  int iVar2;
  pointer pQVar3;
  QuickPacket *pQVar4;
  pointer pRVar5;
  pointer pQVar6;
  undefined4 extraout_var;
  uint64_t sent_time;
  QuicTime local_48;
  uint16_t local_3a;
  pointer puStack_38;
  uint16_t pkt_len;
  QuickPayload *payload;
  QuickPacket *p;
  uint16_t least_unack_sequence_number;
  void *pvStack_20;
  uint16_t data_len_local;
  void *data_local;
  QuickConnection *this_local;
  
  p._6_2_ = data_len;
  pvStack_20 = data;
  data_local = this;
  pQVar3 = std::
           unique_ptr<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
           ::operator->(&this->_unacked_packet_map);
  p._4_2_ = quic::QuicUnackedPacketMap::GetLeastUnackedSequenceNumber(pQVar3);
  bVar1 = quic::IsNewer<unsigned_short>(p._4_2_,this->_sequence_number);
  if ((bVar1) && (p._4_2_ != this->_sequence_number)) {
    this_local._7_1_ = false;
  }
  else {
    pQVar3 = std::
             unique_ptr<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
             ::operator->(&this->_unacked_packet_map);
    pQVar4 = quic::QuicUnackedPacketMap::packet(pQVar3,this->_sequence_number);
    if (pQVar4 == (QuickPacket *)0x0) {
      pRVar5 = std::
               unique_ptr<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>::
               operator->(&this->_wait_send_packets);
      payload = (QuickPayload *)RingBuffer<QuickPacket>::GetWriteablePacket(pRVar5);
      if ((QuickPacket *)payload == (QuickPacket *)0x0) {
        this_local._7_1_ = false;
      }
      else if (p._6_2_ < 0x547) {
        puStack_38 = std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::get
                               (&this->_send_buf);
        local_3a = p._6_2_ + 0x11;
        *puStack_38 = '\x06';
        *(uint32_t *)(puStack_38 + 1) = this->_session_id;
        *(uint16_t *)(puStack_38 + 7) = this->_sequence_number;
        memcpy(puStack_38 + 0x11,pvStack_20,(ulong)p._6_2_);
        this_00 = payload;
        data_00 = puStack_38;
        data_len_00 = local_3a;
        sequence_number = this->_sequence_number;
        this->_sequence_number = sequence_number + 1;
        pQVar6 = std::unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_>::operator->
                           (&this->_clock);
        iVar2 = (*pQVar6->_vptr_QuicClock[3])();
        local_48.time_ = CONCAT44(extraout_var,iVar2);
        sent_time = quic::QuicTime::ToDebuggingValue(&local_48);
        QuickPacket::WriteData((QuickPacket *)this_00,sequence_number,data_00,data_len_00,sent_time)
        ;
        pRVar5 = std::
                 unique_ptr<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>
                 ::operator->(&this->_wait_send_packets);
        RingBuffer<QuickPacket>::WritePacket(pRVar5);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool QuickConnection::SendPayload(const void* data, uint16_t data_len)
{
	// �������� GetLeastUnackedSequenceNumberӦ����Ҫ�����ģ����Ӳ������õ���sequnce_number���жϲ����в���Ӱ�죬
	// Ϊ������Ч�ʣ���û��Ҫ������
	uint16_t least_unack_sequence_number = _unacked_packet_map->GetLeastUnackedSequenceNumber();
	if (quic::IsNewer(least_unack_sequence_number, _sequence_number) && least_unack_sequence_number != _sequence_number) {
		return false;
	}
	// ����_sequence_number�Ѿ��������ڵȴ�ack����ô�Ͳ������ٰ���ͬsequence number�İ����뵽�������С�
	// ������������ͬ��sequence number����Ӧ��ͬ�İ���ԭ������uint16_t�ڸ��ٷ��͵������£��ܶ�ʱ���ھͻᷢ������
	if (_unacked_packet_map->packet(_sequence_number) != nullptr)
		return false;

	auto p = _wait_send_packets->GetWriteablePacket();
	if (p == nullptr)
		return false;
	if (data_len > 1350)
		return false;
	QuickPayload *payload = (QuickPayload*)_send_buf.get();
	uint16_t pkt_len = sizeof(QuickPayload) - 1 + data_len;
	payload->msg_id = QUICK_MSG_PAYLOAD;
	payload->session_id = _session_id;
	payload->sequence_number = _sequence_number;
	memcpy(payload->payload, data, data_len);
	p->WriteData(_sequence_number++, (uint8_t*)payload, pkt_len, _clock->Now().ToDebuggingValue());
	_wait_send_packets->WritePacket();
	// ���ﲻ��Ҫ����Wakup�����������������ٶ�
//	_thread->WakeUp(this);

	
	return true;
}